

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

wchar_t is_mac_metadata_entry(archive_entry *entry)

{
  wchar_t *local_38;
  wchar_t *wname;
  wchar_t *wp;
  char *name;
  char *p;
  archive_entry *entry_local;
  
  local_38 = archive_entry_pathname_w(entry);
  wname = local_38;
  if (local_38 == (wchar_t *)0x0) {
    wp = (wchar_t *)archive_entry_pathname(entry);
    name = (char *)wp;
    if (wp == (wchar_t *)0x0) {
      return L'\xffffffe7';
    }
    for (; *name != '\0'; name = name + 1) {
      if ((*name == '/') && (name[1] != '\0')) {
        wp = (wchar_t *)(name + 1);
      }
    }
    if ((((char)*wp == '.') && (*(char *)((long)wp + 1) == '_')) &&
       (*(char *)((long)wp + 2) != '\0')) {
      return L'\x01';
    }
  }
  else {
    for (; *wname != L'\0'; wname = wname + 1) {
      if ((*wname == L'/') && (wname[1] != L'\0')) {
        local_38 = wname + 1;
      }
    }
    if (((*local_38 == L'.') && (local_38[1] == L'_')) && (local_38[2] != L'\0')) {
      return L'\x01';
    }
  }
  return L'\0';
}

Assistant:

static int
is_mac_metadata_entry(struct archive_entry *entry) {
	const char *p, *name;
	const wchar_t *wp, *wname;

	wname = wp = archive_entry_pathname_w(entry);
	if (wp != NULL) {
		/* Find the last path element. */
		for (; *wp != L'\0'; ++wp) {
			if (wp[0] == '/' && wp[1] != L'\0')
				wname = wp + 1;
		}
		/*
		 * If last path element starts with "._", then
		 * this is a Mac extension.
		 */
		if (wname[0] == L'.' && wname[1] == L'_' && wname[2] != L'\0')
			return 1;
	} else {
		/* Find the last path element. */
		name = p = archive_entry_pathname(entry);
		if (p == NULL)
			return (ARCHIVE_FAILED);
		for (; *p != '\0'; ++p) {
			if (p[0] == '/' && p[1] != '\0')
				name = p + 1;
		}
		/*
		 * If last path element starts with "._", then
		 * this is a Mac extension.
		 */
		if (name[0] == '.' && name[1] == '_' && name[2] != '\0')
			return 1;
	}
	/* Not a mac extension */
	return 0;
}